

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::RedirectedStdErr::RedirectedStdErr(RedirectedStdErr *this)

{
  RedirectedStream *this_00;
  ostream *extraout_RAX;
  ReusableStringStream *in_RDI;
  double __z;
  ostream *in_stack_ffffffffffffffb0;
  ReusableStringStream *redirectionStream;
  ostream *in_stack_ffffffffffffffb8;
  ostream *originalStream;
  ReusableStringStream *in_stack_ffffffffffffffe0;
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffe0);
  cerr();
  this_00 = (RedirectedStream *)ReusableStringStream::get(in_RDI);
  RedirectedStream::RedirectedStream(this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  redirectionStream = in_RDI + 2;
  clog(__z);
  originalStream = extraout_RAX;
  ReusableStringStream::get(in_RDI);
  RedirectedStream::RedirectedStream(this_00,originalStream,(ostream *)redirectionStream);
  return;
}

Assistant:

RedirectedStdErr::RedirectedStdErr()
    :   m_cerr( Catch::cerr(), m_rss.get() ),
        m_clog( Catch::clog(), m_rss.get() )
    {}